

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chromecast.h
# Opt level: O0

bool cc::sendSimple(Connection *conn,Type type,Namespace urn)

{
  char *pcVar1;
  undefined8 __s;
  int __val;
  Connection *pCVar2;
  bool bVar3;
  allocator<char> local_149;
  string local_148;
  allocator<char> local_121;
  string local_120;
  byte local_f9;
  undefined1 local_f8 [6];
  bool ret;
  bool wasVerbose;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  allocator<char> local_41;
  string local_40;
  Namespace local_20;
  Type local_1c;
  Namespace urn_local;
  Type type_local;
  Connection *conn_local;
  
  if ((int)urn < 4) {
    if ((int)type < 5) {
      local_20 = urn;
      local_1c = type;
      _urn_local = conn;
      if ((type == GetStatus) &&
         (bVar3 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)mediaSession_abi_cxx11_,""), pCVar2 = _urn_local,
         __s = ns::strings._24_8_, bVar3)) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_40,(char *)__s,&local_41);
        __val = s_requestId;
        s_requestId = s_requestId + 1;
        std::__cxx11::to_string((string *)local_f8,__val);
        std::operator+(&local_d8,"{  \"type\": \"GET_STATUS\",  \"requestId\": ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8
                      );
        std::operator+(&local_b8,&local_d8,",  \"mediaSessionId\": \"");
        std::operator+(&local_98,&local_b8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       mediaSession_abi_cxx11_);
        std::operator+(&local_78,&local_98,"\"}");
        conn_local._7_1_ = sendMessage(pCVar2,&local_40,&local_78);
        std::__cxx11::string::~string((string *)&local_78);
        std::__cxx11::string::~string((string *)&local_98);
        std::__cxx11::string::~string((string *)&local_b8);
        std::__cxx11::string::~string((string *)&local_d8);
        std::__cxx11::string::~string((string *)local_f8);
        std::__cxx11::string::~string((string *)&local_40);
        std::allocator<char>::~allocator(&local_41);
      }
      else {
        pCVar2 = _urn_local;
        local_f9 = s_verbose & 1;
        if ((local_1c == Ping) || (local_1c == Pong)) {
          s_verbose = false;
        }
        pcVar1 = *(char **)(ns::strings + (ulong)local_20 * 8);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_120,pcVar1,&local_121);
        pcVar1 = sendSimple::msgs[local_1c];
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_148,pcVar1,&local_149);
        bVar3 = sendMessage(pCVar2,&local_120,&local_148);
        std::__cxx11::string::~string((string *)&local_148);
        std::allocator<char>::~allocator(&local_149);
        std::__cxx11::string::~string((string *)&local_120);
        std::allocator<char>::~allocator(&local_121);
        s_verbose = (bool)(local_f9 & 1);
        conn_local._7_1_ = bVar3;
      }
    }
    else {
      conn_local._7_1_ = 0;
    }
  }
  else {
    conn_local._7_1_ = 0;
  }
  return (bool)(conn_local._7_1_ & 1);
}

Assistant:

bool sendSimple(const Connection &conn, const msg::Type type, const ns::Namespace urn)
{
    static const char *msgs[msg::SimpleMessageCount] = {
        "{\"type\": \"CONNECT\"}",
        "{\"type\": \"PING\"}",
        "{\"type\": \"PONG\"}",
        "{\"type\": \"GET_STATUS\", \"requestId\": 1}",
        "{\"type\": \"MEDIA_STATUS\"}"
    };

    if (urn >= ns::NamespacesCount) {
        return false;
    }
    if (type >= msg::SimpleMessageCount) {
        return false;
    }
    if (type == msg::GetStatus && mediaSession != "") {
        return sendMessage(conn,
                ns::strings[ns::Media],
                "{ "
                " \"type\": \"GET_STATUS\", "
                " \"requestId\": " + std::to_string(s_requestId++) + ", "
                " \"mediaSessionId\": \"" + mediaSession + "\""
                "}"
            );
    }

    const bool wasVerbose = s_verbose;
    if (type == msg::Ping || type == msg::Pong) {
        // too much spam
        s_verbose = false;
    }
    const bool ret = sendMessage(conn, ns::strings[urn], msgs[type]);
    s_verbose = wasVerbose;
    return ret;
}